

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void writePrimalSolution(FILE *file,HighsLogOptions *log_options,HighsLp *lp,
                        vector<double,_std::allocator<double>_> *primal_solution,bool sparse)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *this;
  const_reference pvVar3;
  undefined8 uVar4;
  pointer pvVar5;
  vector<double,_std::allocator<double>_> *in_RCX;
  uint *in_RDX;
  HighsLogOptions *in_RSI;
  FILE *in_RDI;
  byte in_R8B;
  string name;
  array<char,_32UL> valStr;
  HighsInt ix;
  stringstream ss;
  HighsInt iCol;
  bool have_col_names;
  HighsInt num_nonzero_primal_value;
  string *in_stack_fffffffffffffc80;
  FILE *s;
  HighsLogOptions *in_stack_fffffffffffffc88;
  HighsLogOptions *log_options_;
  FILE *in_stack_fffffffffffffc90;
  uint local_32c;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [8];
  double in_stack_fffffffffffffd38;
  double in_stack_fffffffffffffd40;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [68];
  uint local_22c;
  string local_228 [32];
  string local_208 [48];
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8;
  int local_30;
  byte local_29;
  int local_28;
  byte local_21;
  vector<double,_std::allocator<double>_> *local_20;
  uint *local_18;
  HighsLogOptions *local_10;
  FILE *local_8;
  
  local_21 = in_R8B & 1;
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDX + 0x52));
  local_29 = sVar1 != 0;
  if ((local_21 & 1) != 0) {
    for (local_30 = 0; local_30 < (int)*local_18; local_30 = local_30 + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_30);
      if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
        local_28 = local_28 + 1;
      }
    }
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::string::string(local_1d8);
  std::__cxx11::stringstream::str((string *)local_1b8);
  std::__cxx11::string::~string(local_1d8);
  if ((local_21 & 1) == 0) {
    local_32c = *local_18;
  }
  else {
    local_32c = -local_28;
  }
  highsFormatToString_abi_cxx11_((char *)local_208,"# Columns %d\n",(ulong)local_32c);
  std::operator<<(&local_1a8,local_208);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::stringstream::str();
  highsFprintfString(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::__cxx11::string::~string(local_228);
  local_22c = 0;
  do {
    if ((int)*local_18 <= (int)local_22c) {
      fflush(local_8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      return;
    }
    if ((local_21 & 1) == 0) {
LAB_005096c2:
      std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)(int)local_22c);
      highsDoubleToString(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::__cxx11::string::string(local_270);
      std::__cxx11::stringstream::str((string *)local_1b8);
      std::__cxx11::string::~string(local_270);
      this = std::operator<<(&local_1a8,"C");
      std::ostream::operator<<(this,local_22c);
      if ((local_29 & 1) == 0) {
        std::__cxx11::stringstream::str();
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_18 + 0x52),(long)(int)local_22c);
        std::__cxx11::string::string(local_290,(string *)pvVar3);
      }
      std::__cxx11::string::string(local_2b0);
      std::__cxx11::stringstream::str((string *)local_1b8);
      std::__cxx11::string::~string(local_2b0);
      uVar4 = std::__cxx11::string::c_str();
      pvVar5 = std::array<char,_32UL>::data((array<char,_32UL> *)0x509805);
      highsFormatToString_abi_cxx11_((char *)local_2d0,"%-s %s",uVar4,pvVar5);
      std::operator<<(&local_1a8,local_2d0);
      std::__cxx11::string::~string(local_2d0);
      if ((local_21 & 1) != 0) {
        in_stack_fffffffffffffc90 = (FILE *)&local_1a8;
        highsFormatToString_abi_cxx11_((char *)local_2f0," %d",(ulong)local_22c);
        std::operator<<((ostream *)in_stack_fffffffffffffc90,local_2f0);
        std::__cxx11::string::~string(local_2f0);
      }
      std::operator<<(&local_1a8,"\n");
      s = local_8;
      log_options_ = local_10;
      std::__cxx11::stringstream::str();
      highsFprintfString(in_stack_fffffffffffffc90,log_options_,(string *)s);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_290);
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_20,(long)(int)local_22c);
      if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) goto LAB_005096c2;
    }
    local_22c = local_22c + 1;
  } while( true );
}

Assistant:

void writePrimalSolution(FILE* file, const HighsLogOptions& log_options,
                         const HighsLp& lp,
                         const std::vector<double>& primal_solution,
                         const bool sparse) {
  HighsInt num_nonzero_primal_value = 0;
  const bool have_col_names = lp.col_names_.size() > 0;
  if (sparse) {
    // Determine the number of nonzero primal solution values
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      if (primal_solution[iCol]) num_nonzero_primal_value++;
  }
  // Indicate the number of column values to be written out, depending
  // on whether format is sparse: either lp.num_col_ if not sparse, or
  // the negation of the number of nonzero values, if sparse

  std::stringstream ss;
  ss.str(std::string());
  ss << highsFormatToString("# Columns %" HIGHSINT_FORMAT "\n",
                            sparse ? -num_nonzero_primal_value : lp.num_col_);
  highsFprintfString(file, log_options, ss.str());
  for (HighsInt ix = 0; ix < lp.num_col_; ix++) {
    if (sparse && !primal_solution[ix]) continue;
    auto valStr = highsDoubleToString(primal_solution[ix],
                                      kHighsSolutionValueToStringTolerance);
    // Create a column name
    ss.str(std::string());
    ss << "C" << ix;
    const std::string name = have_col_names ? lp.col_names_[ix] : ss.str();
    ss.str(std::string());
    ss << highsFormatToString("%-s %s", name.c_str(), valStr.data());
    if (sparse) ss << highsFormatToString(" %d", int(ix));
    ss << "\n";
    highsFprintfString(file, log_options, ss.str());
  }
  fflush(file);
}